

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLMcode state_resolving(Curl_multi *multi,Curl_easy *data,_Bool *stream_errorp,CURLcode *resultp)

{
  char *pcVar1;
  _Bool local_41;
  CURLMcode local_40;
  CURLcode CStack_3c;
  _Bool connected;
  CURLMcode rc;
  CURLcode result;
  Curl_dns_entry *dns;
  CURLcode *resultp_local;
  _Bool *stream_errorp_local;
  Curl_easy *data_local;
  Curl_multi *multi_local;
  
  _rc = (Curl_dns_entry *)0x0;
  local_40 = 0;
  dns = (Curl_dns_entry *)resultp;
  resultp_local = (CURLcode *)stream_errorp;
  stream_errorp_local = (_Bool *)data;
  data_local = (Curl_easy *)multi;
  CStack_3c = Curl_resolv_check(data,(Curl_dns_entry **)&rc);
  if ((((stream_errorp_local != (_Bool *)0x0) &&
       ((*(ulong *)(stream_errorp_local + 0xa2c) >> 0x1e & 1) != 0)) &&
      ((*(long *)(stream_errorp_local + 0x1310) == 0 ||
       (0 < *(int *)(*(long *)(stream_errorp_local + 0x1310) + 8))))) &&
     (0 < Curl_trc_feat_dns.log_level)) {
    pcVar1 = "missing";
    if (_rc != (Curl_dns_entry *)0x0) {
      pcVar1 = "found";
    }
    Curl_trc_dns((Curl_easy *)stream_errorp_local,"Curl_resolv_check() -> %d, %s",(ulong)CStack_3c,
                 pcVar1);
  }
  local_40 = Curl_multi_ev_assess_xfer((Curl_multi *)data_local,(Curl_easy *)stream_errorp_local);
  multi_local._4_4_ = local_40;
  if (local_40 == CURLM_OK) {
    if (_rc != (Curl_dns_entry *)0x0) {
      CStack_3c = Curl_once_resolved((Curl_easy *)stream_errorp_local,&local_41);
      if (CStack_3c == CURLE_OK) {
        local_40 = CURLM_CALL_MULTI_PERFORM;
        if ((local_41 & 1U) == 0) {
          mstate((Curl_easy *)stream_errorp_local,MSTATE_CONNECTING);
        }
        else {
          mstate((Curl_easy *)stream_errorp_local,MSTATE_PROTOCONNECT);
        }
      }
      else {
        stream_errorp_local[0x20] = false;
        stream_errorp_local[0x21] = false;
        stream_errorp_local[0x22] = false;
        stream_errorp_local[0x23] = false;
        stream_errorp_local[0x24] = false;
        stream_errorp_local[0x25] = false;
        stream_errorp_local[0x26] = false;
        stream_errorp_local[0x27] = false;
      }
    }
    if (CStack_3c != CURLE_OK) {
      *(undefined1 *)resultp_local = CURLE_UNSUPPORTED_PROTOCOL;
    }
    *(CURLcode *)&dns->addr = CStack_3c;
    multi_local._4_4_ = local_40;
  }
  return multi_local._4_4_;
}

Assistant:

static CURLMcode state_resolving(struct Curl_multi *multi,
                                 struct Curl_easy *data,
                                 bool *stream_errorp,
                                 CURLcode *resultp)
{
  struct Curl_dns_entry *dns = NULL;
  CURLcode result;
  CURLMcode rc = CURLM_OK;

  result = Curl_resolv_check(data, &dns);
  CURL_TRC_DNS(data, "Curl_resolv_check() -> %d, %s",
               result, dns ? "found" : "missing");
  /* Update sockets here, because the socket(s) may have been closed and the
     application thus needs to be told, even if it is likely that the same
     socket(s) will again be used further down. If the name has not yet been
     resolved, it is likely that new sockets have been opened in an attempt to
     contact another resolver. */
  rc = Curl_multi_ev_assess_xfer(multi, data);
  if(rc)
    return rc;

  if(dns) {
    bool connected;
    /* Perform the next step in the connection phase, and then move on to the
       WAITCONNECT state */
    result = Curl_once_resolved(data, &connected);

    if(result)
      /* if Curl_once_resolved() returns failure, the connection struct is
         already freed and gone */
      data->conn = NULL; /* no more connection */
    else {
      /* call again please so that we get the next socket setup */
      rc = CURLM_CALL_MULTI_PERFORM;
      if(connected)
        multistate(data, MSTATE_PROTOCONNECT);
      else {
        multistate(data, MSTATE_CONNECTING);
      }
    }
  }

  if(result)
    /* failure detected */
    *stream_errorp = TRUE;

  *resultp = result;
  return rc;
}